

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c352.c
# Opt level: O3

UINT8 device_start_c352(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  UINT8 UVar6;
  C352 *c;
  DEV_DATA DVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  short sVar11;
  short sVar12;
  
  DVar7.chipInf = calloc(1,0x6a8);
  if (DVar7.chipInf == (void *)0x0) {
    UVar6 = 0xff;
  }
  else {
    uVar8 = cfg->clock / 0x120;
    *(uint *)&((DEV_DATA *)((long)DVar7.chipInf + 8))->chipInf = uVar8;
    *(UINT8 *)&((DEV_DATA *)((long)DVar7.chipInf + 0x4a0))->chipInf = cfg->flags;
    lVar9 = 0x2c;
    do {
      *(undefined1 *)((long)DVar7.chipInf + lVar9) = 0;
      lVar9 = lVar9 + 0x24;
    } while (lVar9 != 0x4ac);
    uVar10 = 0;
    sVar11 = 0;
    do {
      *(short *)((long)DVar7.chipInf + uVar10 * 2 + 0x4a2) = sVar11 << 5;
      sVar12 = 1;
      if (((0xf < uVar10) && (sVar12 = 2, 0x17 < uVar10)) && (sVar12 = 4, 0x2f < uVar10)) {
        sVar12 = (ushort)(99 < uVar10) * 8 + 8;
      }
      sVar11 = sVar11 + sVar12;
      uVar10 = uVar10 + 1;
    } while (uVar10 != 0x80);
    lVar9 = 0x2d1;
    do {
      puVar2 = (uint *)((long)DVar7.chipInf + lVar9 * 2 + -0x100);
      uVar3 = puVar2[1];
      uVar4 = puVar2[2];
      uVar5 = puVar2[3];
      puVar1 = (uint *)((long)DVar7.chipInf + lVar9 * 2);
      *puVar1 = ~*puVar2 & 0xffe0ffe0;
      puVar1[1] = ~uVar3 & 0xffe0ffe0;
      puVar1[2] = ~uVar4 & 0xffe0ffe0;
      puVar1[3] = ~uVar5 & 0xffe0ffe0;
      lVar9 = lVar9 + 8;
    } while (lVar9 != 0x351);
    *(void **)DVar7.chipInf = DVar7.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar7.chipInf;
    retDevInf->sampleRate = uVar8;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar6 = '\0';
  }
  return UVar6;
}

Assistant:

static UINT8 device_start_c352(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	C352 *c;
	int i;
	INT16 j;

	c = (C352 *)calloc(1, sizeof(C352));
	if (c == NULL)
		return 0xFF;

	c->wave = NULL;
	c->wavesize = 0x00;

	//c->sample_rate_base = cfg->clock / 576;	// sample rate according to superctr
	c->sample_rate_base = cfg->clock / 288;	// TODO: output at 43 KHz and fix sample reading/interpolation code
	c->muteRear = cfg->flags;

	//device_reset_c352(c);

	c352_set_mute_mask(c, 0x00000000);
	
	j=0;
	for(i=0;i<128;i++)
	{
		c->mulaw_table[i] = j<<5;
		if(i < 16)
			j += 1;
		else if(i < 24)
			j += 2;
		else if(i < 48)
			j += 4;
		else if(i < 100)
			j += 8;
		else
			j += 16;
	}
	for(i=128;i<256;i++)
		c->mulaw_table[i] = (~c->mulaw_table[i-128])&~0x1f;

	c->_devData.chipInf = c;
	INIT_DEVINF(retDevInf, &c->_devData, c->sample_rate_base, &devDef);
	return 0x00;
}